

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_pvrtc1_4.cpp
# Opt level: O2

uint64_t __thiscall
basisu::pvrtc4_image::local_endpoint_optimization_opaque
          (pvrtc4_image *this,uint32_t bx,uint32_t by,image *orig_img,bool perceptual)

{
  pvrtc4_block_vector2D *this_00;
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  int iVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint64_t uVar13;
  color_rgba *pcVar14;
  ulong uVar15;
  ulong uVar16;
  pvrtc4_block *ppVar17;
  uint64_t uVar18;
  uint64_t uVar19;
  pvrtc4_block *ppVar20;
  uint64_t uVar21;
  bool bVar22;
  uint uVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  uint uVar27;
  vec<4u,float> *this_01;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  int iVar31;
  uint32_t x;
  long lVar32;
  float (*pafVar33) [7];
  float fVar34;
  float fVar35;
  undefined1 auVar36 [16];
  float *local_170;
  vec3F c_avg_orig;
  float total_weight [2];
  anon_union_4_2_6eba8969_for_color_rgba_0 local_120;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_11c;
  vec3F quant_colors [2];
  pvrtc4_block blocks0 [3] [3];
  pvrtc4_block cur_blocks [3] [3];
  vec4F colors [2];
  
  uVar13 = evaluate_1x1_endpoint_error(this,bx,by,orig_img,perceptual,false,0);
  if (uVar13 == 0) {
    uVar13 = 0;
  }
  else {
    vec<3U,_float>::set(&c_avg_orig,0.0);
    iVar6 = by * 4 + -1;
    for (iVar9 = 0; iVar9 != 7; iVar9 = iVar9 + 1) {
      uVar7 = wrap_y(this,iVar6 + iVar9);
      for (iVar31 = -1; iVar31 != 6; iVar31 = iVar31 + 1) {
        uVar8 = wrap_x(this,iVar31 + bx * 4);
        pcVar14 = image::operator()(orig_img,uVar8,uVar7);
        c_avg_orig.m_v[0] = (float)(pcVar14->field_0).m_comps[0] + c_avg_orig.m_v[0];
        c_avg_orig.m_v[1] = (float)(pcVar14->field_0).m_comps[1] + c_avg_orig.m_v[1];
        c_avg_orig.m_v[2] = (float)(pcVar14->field_0).m_comps[2] + c_avg_orig.m_v[2];
      }
    }
    vec<3U,_float>::operator*=(&c_avg_orig,0.020408163);
    vec<3u,float>::set<3u,float>((vec<3u,float> *)quant_colors,&c_avg_orig);
    vec<3U,_float>::set((vec<3U,_float> *)cur_blocks,0.0125);
    vec<3U,_float>::operator-=((vec<3U,_float> *)quant_colors,(vec<3U,_float> *)cur_blocks);
    vec<3u,float>::set<3u,float>((vec<3u,float> *)(quant_colors + 1),&c_avg_orig);
    vec<3U,_float>::set((vec<3U,_float> *)cur_blocks,0.0125);
    vec<3U,_float>::operator+=((vec<3U,_float> *)(quant_colors + 1),(vec<3U,_float> *)cur_blocks);
    bVar22 = true;
    for (iVar9 = 0; iVar9 != 4; iVar9 = iVar9 + 1) {
      vec<3U,_float>::set((vec<3U,_float> *)cur_blocks,0.0);
      vec<3U,_float>::set((vec<3U,_float> *)&cur_blocks[0][1].m_endpoints,0.0);
      total_weight[0] = 0.0;
      total_weight[1] = 0.0;
      pafVar33 = local_endpoint_optimization_opaque::s_weights;
      for (lVar24 = 0; lVar24 != 7; lVar24 = lVar24 + 1) {
        uVar7 = wrap_y(this,iVar6 + (int)lVar24);
        for (lVar32 = 0; lVar32 != 7; lVar32 = lVar32 + 1) {
          uVar8 = wrap_x(this,bx * 4 + -1 + (int)lVar32);
          pcVar14 = image::operator()(orig_img,uVar8,uVar7);
          auVar36 = pmovzxbd(ZEXT216(*(ushort *)&pcVar14->field_0),
                             ZEXT216(*(ushort *)&pcVar14->field_0));
          blocks0[0][0].m_modulation = (uint32_t)(float)auVar36._0_4_;
          blocks0[0][0].m_endpoints = (uint32_t)(float)auVar36._4_4_;
          blocks0[0][1].m_modulation = (uint32_t)(float)(pcVar14->field_0).m_comps[2];
          fVar34 = vec<3U,_float>::squared_distance(quant_colors,(vec<3U,_float> *)blocks0);
          fVar35 = vec<3U,_float>::squared_distance(quant_colors + 1,(vec<3U,_float> *)blocks0);
          uVar15 = (ulong)(fVar35 < fVar34);
          fVar34 = (*pafVar33)[lVar32];
          operator*((vec<3U,_float> *)blocks0,fVar34);
          vec<3U,_float>::operator+=
                    ((vec<3U,_float> *)((long)cur_blocks[0] + uVar15 * 0xc),(vec<3U,_float> *)colors
                    );
          total_weight[uVar15] = fVar34 + total_weight[uVar15];
        }
        pafVar33 = pafVar33 + 1;
      }
      fVar34 = total_weight[1];
      bVar22 = (bool)((total_weight[1] != 0.0 && total_weight[0] != 0.0) & bVar22);
      operator/((vec<3U,_float> *)cur_blocks,total_weight[0]);
      vec<3U,_float>::operator=(quant_colors,(vec<3U,_float> *)blocks0);
      operator/((vec<3U,_float> *)&cur_blocks[0][1].m_endpoints,fVar34);
      vec<3U,_float>::operator=(quant_colors + 1,(vec<3U,_float> *)blocks0);
    }
    if (!bVar22) {
      vec<3U,_float>::operator=(quant_colors,&c_avg_orig);
      vec<3U,_float>::operator=(quant_colors + 1,&c_avg_orig);
    }
    vec<4u,float>::set<3u,float>((vec<4u,float> *)colors,quant_colors);
    vec<4u,float>::set<3u,float>((vec<4u,float> *)(colors + 1),quant_colors + 1);
    vec<3U,_float>::set((vec<3U,_float> *)blocks0,0.5);
    vec<4u,float>::set<3u,float>((vec<4u,float> *)cur_blocks,(vec<3U,_float> *)blocks0);
    vec<4U,_float>::operator+=((vec<4U,_float> *)colors,(vec<4U,_float> *)cur_blocks);
    local_170 = (float *)blocks0;
    vec<3U,_float>::set((vec<3U,_float> *)local_170,0.5);
    this_01 = (vec<4u,float> *)cur_blocks;
    vec<4u,float>::set<3u,float>(this_01,(vec<3U,_float> *)local_170);
    vec<4U,_float>::operator+=((vec<4U,_float> *)(colors + 1),(vec<4U,_float> *)this_01);
    uVar29 = (uint)colors[0].m_v[0];
    uVar10 = (uint)colors[0].m_v[1];
    uVar27 = (uint)colors[0].m_v[2];
    uVar11 = (uint)colors[1].m_v[0];
    uVar28 = (uint)colors[1].m_v[1];
    uVar12 = (uint)colors[1].m_v[2];
    cur_blocks[2][0].m_modulation = 0;
    cur_blocks[2][0].m_endpoints = 0;
    cur_blocks[2][1].m_modulation = 0;
    cur_blocks[2][1].m_endpoints = 0;
    cur_blocks[1][1].m_modulation = 0;
    cur_blocks[1][1].m_endpoints = 0;
    cur_blocks[1][2].m_modulation = 0;
    cur_blocks[1][2].m_endpoints = 0;
    cur_blocks[2][2].m_modulation = 0;
    cur_blocks[2][2].m_endpoints = 0;
    uVar15 = 0xff;
    if (uVar29 < 0xff) {
      uVar15 = (ulong)uVar29;
    }
    uVar16 = 0xff;
    if (uVar27 < 0xff) {
      uVar16 = (ulong)uVar27;
    }
    cur_blocks[0][2].m_modulation = 0;
    cur_blocks[0][2].m_endpoints = 0;
    cur_blocks[1][0].m_modulation = 0;
    cur_blocks[1][0].m_endpoints = 0;
    uVar30 = 0xff;
    if (uVar28 < 0xff) {
      uVar30 = uVar28;
    }
    uVar25 = (ulong)uVar30;
    cur_blocks[0][0].m_modulation = 0;
    cur_blocks[0][0].m_endpoints = 0;
    cur_blocks[0][1].m_modulation = 0;
    cur_blocks[0][1].m_endpoints = 0;
    this_00 = &this->m_blocks;
    lVar24 = -1;
    while (lVar24 != 2) {
      iVar6 = (int)lVar24;
      lVar24 = lVar24 + 1;
      iVar9 = bx - 1;
      for (lVar32 = 0; lVar32 != 0x48; lVar32 = lVar32 + 0x18) {
        uVar7 = wrap_block_x(this,iVar9);
        uVar8 = wrap_block_y(this,iVar6 + by);
        ppVar17 = vector2D<basisu::pvrtc4_block>::operator()(this_00,uVar7,uVar8);
        *(pvrtc4_block *)(this_01 + lVar32) = *ppVar17;
        iVar9 = iVar9 + 1;
      }
      this_01 = this_01 + 8;
    }
    uVar30 = 0xff;
    if (uVar10 < 0xff) {
      uVar30 = uVar10;
    }
    uVar23 = 0xff;
    if (uVar11 < 0xff) {
      uVar23 = uVar11;
    }
    if ((int)uVar29 < 0) {
      uVar15 = 0;
    }
    uVar26 = (ulong)uVar23;
    if ((int)uVar11 < 0) {
      uVar26 = 0;
    }
    if ((int)uVar10 < 0) {
      uVar30 = 0;
    }
    if ((int)uVar28 < 0) {
      uVar25 = 0;
    }
    uVar1 = g_pvrtc_5_nearest[uVar15];
    uVar2 = g_pvrtc_5_nearest[uVar26];
    uVar3 = g_pvrtc_5_nearest[uVar30];
    uVar4 = g_pvrtc_5_nearest[uVar25];
    if ((int)uVar27 < 0) {
      uVar16 = 0;
    }
    local_11c.m_comps[2] = g_pvrtc_4_nearest[uVar16];
    uVar5 = g_pvrtc_5_nearest[uVar16];
    local_11c.m_comps[3] = '\0';
    local_120.m_comps[3] = '\0';
    local_120.m_comps[0] = uVar2;
    local_120.m_comps[1] = uVar4;
    local_120.m_comps[2] = uVar5;
    local_11c.m_comps[0] = uVar1;
    local_11c.m_comps[1] = uVar3;
    ppVar17 = vector2D<basisu::pvrtc4_block>::operator()(this_00,bx,by);
    pvrtc4_block::set_endpoint_raw(ppVar17,0,(color_rgba *)&local_11c.field_1,true);
    ppVar17 = vector2D<basisu::pvrtc4_block>::operator()(this_00,bx,by);
    pvrtc4_block::set_endpoint_raw(ppVar17,1,(color_rgba *)&local_120.field_1,true);
    uVar18 = remap_pixels_influenced_by_endpoint(this,bx,by,orig_img,perceptual,false);
    blocks0[2][0].m_modulation = 0;
    blocks0[2][0].m_endpoints = 0;
    blocks0[2][1].m_modulation = 0;
    blocks0[2][1].m_endpoints = 0;
    blocks0[1][1].m_modulation = 0;
    blocks0[1][1].m_endpoints = 0;
    blocks0[1][2].m_modulation = 0;
    blocks0[1][2].m_endpoints = 0;
    blocks0[2][2].m_modulation = 0;
    blocks0[2][2].m_endpoints = 0;
    blocks0[0][2].m_modulation = 0;
    blocks0[0][2].m_endpoints = 0;
    blocks0[1][0].m_modulation = 0;
    blocks0[1][0].m_endpoints = 0;
    blocks0[0][0].m_modulation = 0;
    blocks0[0][0].m_endpoints = 0;
    blocks0[0][1].m_modulation = 0;
    blocks0[0][1].m_endpoints = 0;
    lVar24 = -1;
    while (lVar24 != 2) {
      iVar6 = (int)lVar24;
      lVar24 = lVar24 + 1;
      iVar9 = bx - 1;
      for (lVar32 = 0; lVar32 != 0x48; lVar32 = lVar32 + 0x18) {
        uVar7 = wrap_block_x(this,iVar9);
        uVar8 = wrap_block_y(this,iVar6 + by);
        ppVar17 = vector2D<basisu::pvrtc4_block>::operator()(this_00,uVar7,uVar8);
        *(pvrtc4_block *)((long)local_170 + lVar32) = *ppVar17;
        iVar9 = iVar9 + 1;
      }
      local_170 = local_170 + 2;
    }
    uVar10 = 0xff;
    if (uVar12 < 0xff) {
      uVar10 = uVar12;
    }
    uVar15 = (ulong)uVar10;
    if ((int)uVar12 < 0) {
      uVar15 = 0;
    }
    local_11c.m_comps[2] = g_pvrtc_4_nearest[uVar15];
    local_11c.m_comps[3] = '\0';
    local_120.m_comps[3] = '\0';
    local_120.m_comps[0] = uVar1;
    local_120.m_comps[1] = uVar3;
    local_120.m_comps[2] = uVar5;
    local_11c.m_comps[0] = uVar2;
    local_11c.m_comps[1] = uVar4;
    ppVar17 = vector2D<basisu::pvrtc4_block>::operator()(this_00,bx,by);
    pvrtc4_block::set_endpoint_raw(ppVar17,0,(color_rgba *)&local_11c.field_1,true);
    ppVar17 = vector2D<basisu::pvrtc4_block>::operator()(this_00,bx,by);
    pvrtc4_block::set_endpoint_raw(ppVar17,1,(color_rgba *)&local_120.field_1,true);
    uVar19 = remap_pixels_influenced_by_endpoint(this,bx,by,orig_img,perceptual,false);
    uVar21 = uVar19;
    if (uVar18 < uVar19) {
      uVar21 = uVar18;
    }
    if (uVar13 < uVar21) {
      lVar24 = -1;
      ppVar17 = cur_blocks[0];
      while (lVar24 != 2) {
        iVar6 = (int)lVar24;
        lVar24 = lVar24 + 1;
        iVar9 = bx - 1;
        for (lVar32 = 0; lVar32 != 0x48; lVar32 = lVar32 + 0x18) {
          uVar7 = wrap_block_x(this,iVar9);
          uVar8 = wrap_block_y(this,iVar6 + by);
          ppVar20 = vector2D<basisu::pvrtc4_block>::operator()(this_00,uVar7,uVar8);
          *ppVar20 = *(pvrtc4_block *)
                      ((long)&((pvrtc4_block *)&ppVar17->m_modulation)->m_modulation + lVar32);
          iVar9 = iVar9 + 1;
        }
        ppVar17 = ppVar17 + 1;
      }
    }
    else if (uVar18 < uVar19) {
      lVar24 = -1;
      ppVar17 = blocks0[0];
      while (lVar24 != 2) {
        iVar6 = (int)lVar24;
        lVar24 = lVar24 + 1;
        iVar9 = bx - 1;
        for (lVar32 = 0; lVar32 != 0x48; lVar32 = lVar32 + 0x18) {
          uVar7 = wrap_block_x(this,iVar9);
          uVar8 = wrap_block_y(this,iVar6 + by);
          ppVar20 = vector2D<basisu::pvrtc4_block>::operator()(this_00,uVar7,uVar8);
          *ppVar20 = *(pvrtc4_block *)
                      ((long)&((pvrtc4_block *)&ppVar17->m_modulation)->m_modulation + lVar32);
          iVar9 = iVar9 + 1;
        }
        ppVar17 = ppVar17 + 1;
      }
      uVar21 = evaluate_1x1_endpoint_error(this,bx,by,orig_img,perceptual,false,0);
      uVar13 = uVar18;
      if (uVar18 != uVar21) {
        __assert_fail("e03_err_0 == evaluate_1x1_endpoint_error(bx, by, orig_img, perceptual, false)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_pvrtc1_4.cpp"
                      ,0x22c,
                      "uint64_t basisu::pvrtc4_image::local_endpoint_optimization_opaque(uint32_t, uint32_t, const image &, bool)"
                     );
      }
    }
    else {
      uVar18 = evaluate_1x1_endpoint_error(this,bx,by,orig_img,perceptual,false,0);
      uVar13 = uVar19;
      if (uVar19 != uVar18) {
        __assert_fail("e03_err_1 == evaluate_1x1_endpoint_error(bx, by, orig_img, perceptual, false)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_pvrtc1_4.cpp"
                      ,0x230,
                      "uint64_t basisu::pvrtc4_image::local_endpoint_optimization_opaque(uint32_t, uint32_t, const image &, bool)"
                     );
      }
    }
  }
  return uVar13;
}

Assistant:

uint64_t pvrtc4_image::local_endpoint_optimization_opaque(uint32_t bx, uint32_t by, const image& orig_img, bool perceptual)
	{
		uint64_t initial_error = evaluate_1x1_endpoint_error(bx, by, orig_img, perceptual, false);
		if (!initial_error)
			return initial_error;

		vec3F c_avg_orig(0);

		for (int y = 0; y < 7; y++)
		{
			const uint32_t py = wrap_y(by * 4 + y - 1);
			for (uint32_t x = 0; x < 7; x++)
			{
				const uint32_t px = wrap_x(bx * 4 + x - 1);

				const color_rgba& c = orig_img(px, py);

				c_avg_orig[0] += c[0];
				c_avg_orig[1] += c[1];
				c_avg_orig[2] += c[2];
			}
		}

		c_avg_orig *= 1.0f / 49.0f;

		vec3F quant_colors[2];
		quant_colors[0].set(c_avg_orig);
		quant_colors[0] -= vec3F(.0125f);

		quant_colors[1].set(c_avg_orig);
		quant_colors[1] += vec3F(.0125f);

		float total_weight[2];

		bool success = true;

		for (uint32_t pass = 0; pass < 4; pass++)
		{
			vec3F new_colors[2] = { vec3F(0), vec3F(0) };
			memset(total_weight, 0, sizeof(total_weight));

			static const float s_weights[7][7] =
			{
				{ 1.000000f, 1.637089f, 2.080362f, 2.242640f, 2.080362f, 1.637089f, 1.000000f },
				{ 1.637089f, 2.414213f, 3.006572f, 3.242640f, 3.006572f, 2.414213f, 1.637089f },
				{ 2.080362f, 3.006572f, 3.828426f, 4.242640f, 3.828426f, 3.006572f, 2.080362f },
				{ 2.242640f, 3.242640f, 4.242640f, 5.000000f, 4.242640f, 3.242640f, 2.242640f },
				{ 2.080362f, 3.006572f, 3.828426f, 4.242640f, 3.828426f, 3.006572f, 2.080362f },
				{ 1.637089f, 2.414213f, 3.006572f, 3.242640f, 3.006572f, 2.414213f, 1.637089f },
				{ 1.000000f, 1.637089f, 2.080362f, 2.242640f, 2.080362f, 1.637089f, 1.000000f }
			};

			for (int y = 0; y < 7; y++)
			{
				const uint32_t py = wrap_y(by * 4 + y - 1);
				for (uint32_t x = 0; x < 7; x++)
				{
					const uint32_t px = wrap_x(bx * 4 + x - 1);

					const color_rgba& orig_c = orig_img(px, py);

					vec3F color(orig_c[0], orig_c[1], orig_c[2]);

					uint32_t c = quant_colors[0].squared_distance(color) > quant_colors[1].squared_distance(color);

					const float weight = s_weights[y][x];
					new_colors[c] += color * weight;

					total_weight[c] += weight;
				}
			}

			if (!total_weight[0] || !total_weight[1])
				success = false;

			quant_colors[0] = new_colors[0] / (float)total_weight[0];
			quant_colors[1] = new_colors[1] / (float)total_weight[1];
		}

		if (!success)
		{
			quant_colors[0] = c_avg_orig;
			quant_colors[1] = c_avg_orig;
		}

		vec4F colors[2] = { quant_colors[0], quant_colors[1] };

		colors[0] += vec3F(.5f);
		colors[1] += vec3F(.5f);
		color_rgba color_0((int)colors[0][0], (int)colors[0][1], (int)colors[0][2], 0);
		color_rgba color_1((int)colors[1][0], (int)colors[1][1], (int)colors[1][2], 0);

		pvrtc4_block cur_blocks[3][3];
		
		for (int y = -1; y <= 1; y++)
		{
			for (int x = -1; x <= 1; x++)
			{
				const uint32_t block_x = wrap_block_x(bx + x);
				const uint32_t block_y = wrap_block_y(by + y);
				cur_blocks[x + 1][y + 1] = m_blocks(block_x, block_y);
			}
		}

		color_rgba l1(0), h1(0);

		l1[0] = g_pvrtc_5_nearest[color_0[0]];
		h1[0] = g_pvrtc_5_nearest[color_1[0]];

		l1[1] = g_pvrtc_5_nearest[color_0[1]];
		h1[1] = g_pvrtc_5_nearest[color_1[1]];

		l1[2] = g_pvrtc_4_nearest[color_0[2]];
		h1[2] = g_pvrtc_5_nearest[color_0[2]];

		l1[3] = 0;
		h1[3] = 0;

		m_blocks(bx, by).set_endpoint_raw(0, l1, true);
		m_blocks(bx, by).set_endpoint_raw(1, h1, true);

		uint64_t e03_err_0 = remap_pixels_influenced_by_endpoint(bx, by, orig_img, perceptual, false);

		pvrtc4_block blocks0[3][3];
		for (int y = -1; y <= 1; y++)
		{
			for (int x = -1; x <= 1; x++)
			{
				const uint32_t block_x = wrap_block_x(bx + x);
				const uint32_t block_y = wrap_block_y(by + y);
				blocks0[x + 1][y + 1] = m_blocks(block_x, block_y);
			}
		}

		l1[0] = g_pvrtc_5_nearest[color_1[0]];
		h1[0] = g_pvrtc_5_nearest[color_0[0]];

		l1[1] = g_pvrtc_5_nearest[color_1[1]];
		h1[1] = g_pvrtc_5_nearest[color_0[1]];

		l1[2] = g_pvrtc_4_nearest[color_1[2]];
		h1[2] = g_pvrtc_5_nearest[color_0[2]];

		l1[3] = 0;
		h1[3] = 0;

		m_blocks(bx, by).set_endpoint_raw(0, l1, true);
		m_blocks(bx, by).set_endpoint_raw(1, h1, true);

		uint64_t e03_err_1 = remap_pixels_influenced_by_endpoint(bx, by, orig_img, perceptual, false);

		if (initial_error < basisu::minimum(e03_err_0, e03_err_1))
		{
			for (int y = -1; y <= 1; y++)
			{
				for (int x = -1; x <= 1; x++)
				{
					const uint32_t block_x = wrap_block_x(bx + x);
					const uint32_t block_y = wrap_block_y(by + y);
					m_blocks(block_x, block_y) = cur_blocks[x + 1][y + 1];
				}
			}
			return initial_error;
		}
		else if (e03_err_0 < e03_err_1)
		{
			for (int y = -1; y <= 1; y++)
			{
				for (int x = -1; x <= 1; x++)
				{
					const uint32_t block_x = wrap_block_x(bx + x);
					const uint32_t block_y = wrap_block_y(by + y);
					m_blocks(block_x, block_y) = blocks0[x + 1][y + 1];
				}
			}
			assert(e03_err_0 == evaluate_1x1_endpoint_error(bx, by, orig_img, perceptual, false));
			return e03_err_0;
		}

		assert(e03_err_1 == evaluate_1x1_endpoint_error(bx, by, orig_img, perceptual, false));
		return e03_err_1;
	}